

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O1

void png_write_info_before_PLTE(png_structrp png_ptr,png_const_inforp info_ptr)

{
  byte *pbVar1;
  png_uint_16 pVar2;
  
  if ((info_ptr != (png_const_inforp)0x0 && png_ptr != (png_structrp)0x0) &&
     ((png_ptr->mode & 0x400) == 0)) {
    png_write_sig(png_ptr);
    if (((png_ptr->mode & 0x1000) != 0) && (png_ptr->mng_features_permitted != 0)) {
      png_warning(png_ptr,"MNG features are not allowed in a PNG datastream");
      png_ptr->mng_features_permitted = 0;
    }
    png_write_IHDR(png_ptr,info_ptr->width,info_ptr->height,(uint)info_ptr->bit_depth,
                   (uint)info_ptr->color_type,(uint)info_ptr->compression_type,
                   (uint)info_ptr->filter_type,(uint)info_ptr->interlace_type);
    if ((((info_ptr->colorspace).flags & 0x8008) == 8) && ((info_ptr->valid & 1) != 0)) {
      png_write_gAMA_fixed(png_ptr,(info_ptr->colorspace).gamma);
    }
    pVar2 = (info_ptr->colorspace).flags;
    if (-1 < (short)pVar2) {
      if ((info_ptr->valid >> 0xc & 1) == 0) {
        if ((-1 < (short)pVar2) && ((info_ptr->valid & 0x800) != 0)) {
          png_write_sRGB(png_ptr,(uint)(info_ptr->colorspace).rendering_intent);
        }
      }
      else {
        if ((info_ptr->valid >> 0xb & 1) != 0) {
          png_app_warning(png_ptr,"profile matches sRGB but writing iCCP instead");
        }
        png_write_iCCP(png_ptr,info_ptr->iccp_name,info_ptr->iccp_profile);
      }
    }
    if ((info_ptr->valid & 2) != 0) {
      png_write_sBIT(png_ptr,&info_ptr->sig_bit,(uint)info_ptr->color_type);
    }
    if ((((info_ptr->colorspace).flags & 0x8010) == 0x10) && ((info_ptr->valid & 4) != 0)) {
      png_write_cHRM_fixed(png_ptr,&(info_ptr->colorspace).end_points_xy);
    }
    write_unknown_chunks(png_ptr,info_ptr,1);
    pbVar1 = (byte *)((long)&png_ptr->mode + 1);
    *pbVar1 = *pbVar1 | 4;
  }
  return;
}

Assistant:

void PNGAPI
png_write_info_before_PLTE(png_structrp png_ptr, png_const_inforp info_ptr)
{
   png_debug(1, "in png_write_info_before_PLTE");

   if (png_ptr == NULL || info_ptr == NULL)
      return;

   if ((png_ptr->mode & PNG_WROTE_INFO_BEFORE_PLTE) == 0)
   {
      /* Write PNG signature */
      png_write_sig(png_ptr);

#ifdef PNG_MNG_FEATURES_SUPPORTED
      if ((png_ptr->mode & PNG_HAVE_PNG_SIGNATURE) != 0 && \
          png_ptr->mng_features_permitted != 0)
      {
         png_warning(png_ptr,
             "MNG features are not allowed in a PNG datastream");
         png_ptr->mng_features_permitted = 0;
      }
#endif

      /* Write IHDR information. */
      png_write_IHDR(png_ptr, info_ptr->width, info_ptr->height,
          info_ptr->bit_depth, info_ptr->color_type, info_ptr->compression_type,
          info_ptr->filter_type,
#ifdef PNG_WRITE_INTERLACING_SUPPORTED
          info_ptr->interlace_type
#else
          0
#endif
         );

      /* The rest of these check to see if the valid field has the appropriate
       * flag set, and if it does, writes the chunk.
       *
       * 1.6.0: COLORSPACE support controls the writing of these chunks too, and
       * the chunks will be written if the WRITE routine is there and
       * information * is available in the COLORSPACE. (See
       * png_colorspace_sync_info in png.c for where the valid flags get set.)
       *
       * Under certain circumstances the colorspace can be invalidated without
       * syncing the info_struct 'valid' flags; this happens if libpng detects
       * an error and calls png_error while the color space is being set, yet
       * the application continues writing the PNG.  So check the 'invalid'
       * flag here too.
       */
#ifdef PNG_GAMMA_SUPPORTED
#  ifdef PNG_WRITE_gAMA_SUPPORTED
      if ((info_ptr->colorspace.flags & PNG_COLORSPACE_INVALID) == 0 &&
          (info_ptr->colorspace.flags & PNG_COLORSPACE_FROM_gAMA) != 0 &&
          (info_ptr->valid & PNG_INFO_gAMA) != 0)
         png_write_gAMA_fixed(png_ptr, info_ptr->colorspace.gamma);
#  endif
#endif

#ifdef PNG_COLORSPACE_SUPPORTED
      /* Write only one of sRGB or an ICC profile.  If a profile was supplied
       * and it matches one of the known sRGB ones issue a warning.
       */
#  ifdef PNG_WRITE_iCCP_SUPPORTED
         if ((info_ptr->colorspace.flags & PNG_COLORSPACE_INVALID) == 0 &&
             (info_ptr->valid & PNG_INFO_iCCP) != 0)
         {
#    ifdef PNG_WRITE_sRGB_SUPPORTED
               if ((info_ptr->valid & PNG_INFO_sRGB) != 0)
                  png_app_warning(png_ptr,
                      "profile matches sRGB but writing iCCP instead");
#     endif

            png_write_iCCP(png_ptr, info_ptr->iccp_name,
                info_ptr->iccp_profile);
         }
#     ifdef PNG_WRITE_sRGB_SUPPORTED
         else
#     endif
#  endif

#  ifdef PNG_WRITE_sRGB_SUPPORTED
         if ((info_ptr->colorspace.flags & PNG_COLORSPACE_INVALID) == 0 &&
             (info_ptr->valid & PNG_INFO_sRGB) != 0)
            png_write_sRGB(png_ptr, info_ptr->colorspace.rendering_intent);
#  endif /* WRITE_sRGB */
#endif /* COLORSPACE */

#ifdef PNG_WRITE_sBIT_SUPPORTED
         if ((info_ptr->valid & PNG_INFO_sBIT) != 0)
            png_write_sBIT(png_ptr, &(info_ptr->sig_bit), info_ptr->color_type);
#endif

#ifdef PNG_COLORSPACE_SUPPORTED
#  ifdef PNG_WRITE_cHRM_SUPPORTED
         if ((info_ptr->colorspace.flags & PNG_COLORSPACE_INVALID) == 0 &&
             (info_ptr->colorspace.flags & PNG_COLORSPACE_FROM_cHRM) != 0 &&
             (info_ptr->valid & PNG_INFO_cHRM) != 0)
            png_write_cHRM_fixed(png_ptr, &info_ptr->colorspace.end_points_xy);
#  endif
#endif

#ifdef PNG_WRITE_UNKNOWN_CHUNKS_SUPPORTED
         write_unknown_chunks(png_ptr, info_ptr, PNG_HAVE_IHDR);
#endif

      png_ptr->mode |= PNG_WROTE_INFO_BEFORE_PLTE;
   }
}